

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qwidget.cpp
# Opt level: O3

void __thiscall QWidgetPrivate::inheritStyle(QWidgetPrivate *this)

{
  QWidget *w;
  QWExtra *pQVar1;
  QArrayData *pQVar2;
  QStyleSheetStyle *pQVar3;
  long lVar4;
  QStyleSheetStyle *base;
  QStyleSheetStyle *pQVar5;
  long in_FS_OFFSET;
  QString local_50;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  w = *(QWidget **)&this->field_0x8;
  pQVar1 = (this->extra)._M_t.super___uniq_ptr_impl<QWExtra,_std::default_delete<QWExtra>_>._M_t.
           super__Tuple_impl<0UL,_QWExtra_*,_std::default_delete<QWExtra>_>.
           super__Head_base<0UL,_QWExtra_*,_false>._M_head_impl;
  if (((pQVar1 == (QWExtra *)0x0) || (lVar4 = (long)(pQVar1->style).wp.d, lVar4 == 0)) ||
     (*(int *)(lVar4 + 4) == 0)) {
    pQVar5 = (QStyleSheetStyle *)0x0;
  }
  else {
    pQVar5 = *(QStyleSheetStyle **)((long)&(pQVar1->style).wp + 8);
  }
  pQVar3 = (QStyleSheetStyle *)QMetaObject::cast((QObject *)&QStyleSheetStyle::staticMetaObject);
  lVar4 = *(long *)(*(long *)&w->field_0x8 + 0x78);
  if (lVar4 != 0) {
    pQVar2 = *(QArrayData **)(lVar4 + 0x48);
    lVar4 = *(long *)(lVar4 + 0x58);
    if (pQVar2 != (QArrayData *)0x0) {
      LOCK();
      (pQVar2->ref_)._q_value.super___atomic_base<int>._M_i =
           (pQVar2->ref_)._q_value.super___atomic_base<int>._M_i + 1;
      UNLOCK();
      LOCK();
      (pQVar2->ref_)._q_value.super___atomic_base<int>._M_i =
           (pQVar2->ref_)._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((pQVar2->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(pQVar2,2,0x10);
      }
    }
    if (lVar4 != 0) {
      if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
        QStyleSheetStyle::repolish(pQVar3,w);
        return;
      }
      goto LAB_002fdc26;
    }
  }
  base = pQVar5;
  if (pQVar3 != (QStyleSheetStyle *)0x0) {
    base = *(QStyleSheetStyle **)(pQVar3 + 0x10);
  }
  lVar4 = *(long *)(*(long *)&w->field_0x8 + 0x10);
  if (((lVar4 == 0) || (lVar4 = *(long *)(*(long *)(lVar4 + 8) + 0x78), lVar4 == 0)) ||
     ((*(long *)(lVar4 + 0x20) == 0 || (*(int *)(*(long *)(lVar4 + 0x20) + 4) == 0)))) {
    pQVar3 = (QStyleSheetStyle *)0x0;
  }
  else {
    pQVar3 = *(QStyleSheetStyle **)(lVar4 + 0x28);
  }
  QApplication::styleSheet(&local_50,QCoreApplication::self);
  if (local_50.d.size == 0) {
    lVar4 = QMetaObject::cast((QObject *)&QStyleSheetStyle::staticMetaObject);
    if (&(local_50.d.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((local_50.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_50.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if (((local_50.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(&(local_50.d.d)->super_QArrayData,2,0x10);
      }
    }
    if (lVar4 != 0) goto LAB_002fdb6c;
    if (base != pQVar5) {
      if ((*(uint *)(*(long *)&w->field_0x8 + 0x244) >> 0x16 & 1) == 0) {
        base = (QStyleSheetStyle *)0x0;
      }
      goto LAB_002fdbde;
    }
  }
  else {
    if (&(local_50.d.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((local_50.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_50.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if (((local_50.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(&(local_50.d.d)->super_QArrayData,2,0x10);
      }
    }
LAB_002fdb6c:
    if (((*(byte *)(*(long *)&w->field_0x8 + 0x246) & 0x40) == 0) ||
       (lVar4 = QMetaObject::cast((QObject *)&QStyleSheetStyle::staticMetaObject), lVar4 != 0)) {
      base = (QStyleSheetStyle *)QMetaObject::cast((QObject *)&QStyleSheetStyle::staticMetaObject);
      if ((base == (QStyleSheetStyle *)0x0) &&
         (lVar4 = QMetaObject::cast((QObject *)&QStyleSheetStyle::staticMetaObject), base = pQVar3,
         lVar4 != 0)) {
        *(int *)(lVar4 + 0x18) = *(int *)(lVar4 + 0x18) + 1;
      }
    }
    else {
      pQVar5 = (QStyleSheetStyle *)operator_new(0x60);
      QStyleSheetStyle::QStyleSheetStyle(pQVar5,(QStyle *)base);
      base = pQVar5;
    }
LAB_002fdbde:
    setStyle_helper(this,(QStyle *)base,true);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
LAB_002fdc26:
  __stack_chk_fail();
}

Assistant:

void QWidgetPrivate::inheritStyle()
{
#ifndef QT_NO_STYLE_STYLESHEET
    Q_Q(QWidget);

    QStyle *extraStyle = extra ? (QStyle*)extra->style : nullptr;

    QStyleSheetStyle *proxy = qt_styleSheet(extraStyle);

    if (!q->styleSheet().isEmpty()) {
        Q_ASSERT(proxy);
        proxy->repolish(q);
        return;
    }

    QStyle *origStyle = proxy ? proxy->base : extraStyle;
    QWidget *parent = q->parentWidget();
    QStyle *parentStyle = (parent && parent->d_func()->extra) ? (QStyle*)parent->d_func()->extra->style : nullptr;
    // If we have stylesheet on app or parent has stylesheet style, we need
    // to be running a proxy
    if (!qApp->styleSheet().isEmpty() || qt_styleSheet(parentStyle)) {
        QStyle *newStyle = parentStyle;
        if (q->testAttribute(Qt::WA_SetStyle) && qt_styleSheet(origStyle) == nullptr)
            newStyle = new QStyleSheetStyle(origStyle);
        else if (auto *styleSheetStyle = qt_styleSheet(origStyle))
            newStyle = styleSheetStyle;
        else if (QStyleSheetStyle *newProxy = qt_styleSheet(parentStyle))
            newProxy->ref();

        setStyle_helper(newStyle, true);
        return;
    }

    // So, we have no stylesheet on parent/app and we have an empty stylesheet
    // we just need our original style back
    if (origStyle == extraStyle) // is it any different?
        return;

    // We could have inherited the proxy from our parent (which has a custom style)
    // In such a case we need to start following the application style (i.e revert
    // the propagation behavior of QStyleSheetStyle)
    if (!q->testAttribute(Qt::WA_SetStyle))
        origStyle = nullptr;

    setStyle_helper(origStyle, true);
#endif // QT_NO_STYLE_STYLESHEET
}